

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O2

void __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::delete_node(hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
              *this,index_pointer node,uint shifts)

{
  if (((ulong)node.internal_ & 2) != 0) {
    if (((ulong)node.internal_ & 1) == 0) {
      assert_failed("!node.is_leaf ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x315);
    }
    if (0x41 < shifts) {
      details::linear_node::operator_delete((void *)((ulong)node.internal_ & 0xfffffffffffffffc));
      return;
    }
  }
  return;
}

Assistant:

bool is_heap () const noexcept {
                    return (reinterpret_cast<std::uintptr_t> (internal_) & heap_node_bit) != 0U;
                }